

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O1

ErrCode __thiscall HttpHeaderBase::getFieldInt64(HttpHeaderBase *this,FieldType type,int64_t *value)

{
  longlong lVar1;
  long lVar2;
  char *__nptr;
  
  if ((long)this->mNumFields < 1) {
    __nptr = (char *)0x0;
  }
  else {
    __nptr = (char *)0x0;
    lVar2 = 0;
    do {
      if (*(int *)((long)&this->mFields[0].mType + lVar2) == type) {
        __nptr = *(char **)((long)&this->mFields[0].mData + lVar2);
        break;
      }
      lVar2 = lVar2 + 0x10;
    } while ((long)this->mNumFields * 0x10 != lVar2);
  }
  if (__nptr == (char *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = strtoll(__nptr,(char **)0x0,0);
  }
  *value = lVar1;
  return (uint)(__nptr == (char *)0x0);
}

Assistant:

ErrCode HttpHeaderBase::getFieldInt64(FieldMap::FieldType type,
									  int64_t &value) const
{
	const char *str = getField(type);
	
	if (str != NULL)
	{
		value = strtoll(str, NULL, 0);
		return kNoError;
	}
	
	value = 0;
	return kNotFound;
}